

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trim_capabilities_pass.cpp
# Opt level: O0

optional<spv::Capability>
spvtools::opt::Handler_OpTypePointer_StoragePushConstant16(Instruction *instruction)

{
  bool bVar1;
  Op OVar2;
  IRContext *this;
  FeatureManager *feature_manager;
  Capability local_24 [2];
  uint32_t local_1c;
  Instruction *pIStack_18;
  StorageClass storage_class;
  Instruction *instruction_local;
  
  pIStack_18 = instruction;
  OVar2 = Instruction::opcode(instruction);
  if (OVar2 == OpTypePointer) {
    local_1c = Instruction::GetSingleWordInOperand(pIStack_18,0);
    if (local_1c == 9) {
      this = Instruction::context(pIStack_18);
      feature_manager = IRContext::get_feature_mgr(this);
      bVar1 = anon_unknown_10::Has16BitCapability(feature_manager);
      if (bVar1) {
        bVar1 = (anonymous_namespace)::AnyTypeOf<bool(*)(spvtools::opt::Instruction_const*)>
                          (pIStack_18,anon_unknown_10::is16bitType);
        if (bVar1) {
          local_24[0] = StoragePushConstant16;
          std::optional<spv::Capability>::optional<spv::Capability,_true>
                    ((optional<spv::Capability> *)&instruction_local,local_24);
        }
        else {
          std::optional<spv::Capability>::optional((optional<spv::Capability> *)&instruction_local);
        }
      }
      else {
        std::optional<spv::Capability>::optional((optional<spv::Capability> *)&instruction_local);
      }
    }
    else {
      std::optional<spv::Capability>::optional((optional<spv::Capability> *)&instruction_local);
    }
    return (_Optional_base<spv::Capability,_true,_true>)
           (_Optional_base<spv::Capability,_true,_true>)instruction_local;
  }
  __assert_fail("instruction->opcode() == spv::Op::OpTypePointer && \"This handler only support OpTypePointer opcodes.\""
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/trim_capabilities_pass.cpp"
                ,0xba,
                "std::optional<spv::Capability> spvtools::opt::Handler_OpTypePointer_StoragePushConstant16(const Instruction *)"
               );
}

Assistant:

static std::optional<spv::Capability>
Handler_OpTypePointer_StoragePushConstant16(const Instruction* instruction) {
  assert(instruction->opcode() == spv::Op::OpTypePointer &&
         "This handler only support OpTypePointer opcodes.");

  // This capability is only required if the variable has a PushConstant storage
  // class.
  spv::StorageClass storage_class = spv::StorageClass(
      instruction->GetSingleWordInOperand(kOpTypePointerStorageClassIndex));
  if (storage_class != spv::StorageClass::PushConstant) {
    return std::nullopt;
  }

  if (!Has16BitCapability(instruction->context()->get_feature_mgr())) {
    return std::nullopt;
  }

  return AnyTypeOf(instruction, is16bitType)
             ? std::optional(spv::Capability::StoragePushConstant16)
             : std::nullopt;
}